

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCIIHexDecoder.hh
# Opt level: O0

void __thiscall Pl_ASCIIHexDecoder::~Pl_ASCIIHexDecoder(Pl_ASCIIHexDecoder *this)

{
  Pl_ASCIIHexDecoder *this_local;
  
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

~Pl_ASCIIHexDecoder() final = default;